

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

bool __thiscall QSqlTableModel::selectRow(QSqlTableModel *this,int row)

{
  QString *this_00;
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  bool exists;
  bool bVar6;
  int iVar7;
  int iVar8;
  QSqlDriver *pQVar9;
  ModifiedRow *this_01;
  Orientation row_00;
  long in_FS_OFFSET;
  QLatin1StringView QVar10;
  QLatin1StringView QVar11;
  QArrayDataPointer<int> local_f8;
  QSqlRecord curValues;
  QSqlRecord newValues;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  int row_local;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QSqlQuery q;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  row_local = row;
  if (-1 < row) {
    lVar3 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
    _q = ZEXT816(0xffffffffffffffff);
    iVar7 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))();
    if (row < iVar7) {
      uVar1 = *(undefined4 *)(lVar3 + 0x230);
      *(undefined4 *)(lVar3 + 0x230) = 0xffffffff;
      local_98.d = *(Data **)(lVar3 + 0x2b0);
      local_98.ptr = *(char16_t **)(lVar3 + 0x2b8);
      local_98.size = *(qsizetype *)(lVar3 + 0x2c0);
      if (local_98.d != (Data *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this_00 = (QString *)(lVar3 + 0x2b0);
      pQVar9 = QSqlDatabase::driver((QSqlDatabase *)(lVar3 + 0x228));
      row_00 = (Orientation)this;
      primaryValues((QSqlTableModel *)&local_78,row_00);
      (**(code **)(*(long *)pQVar9 + 0xa8))
                ((QArrayDataPointer<char16_t> *)&q,pQVar9,0,lVar3 + 0x298,&local_78,0);
      QVar10 = *(QLatin1StringView *)(lVar3 + 0x2b0);
      *(QSqlQueryPrivate **)(lVar3 + 0x2b0) = q.d;
      *(undefined8 *)(lVar3 + 0x2b8) = uStack_50;
      uStack_48 = *(long *)(lVar3 + 0x2c0);
      *(undefined8 *)(lVar3 + 0x2c0) = 0;
      _q = (undefined1  [16])QVar10;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&q);
      QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78.shared);
      if (selectRow(int)::wh == '\0') {
        iVar7 = __cxa_guard_acquire(&selectRow(int)::wh);
        if (iVar7 != 0) {
          QVar10 = QSqlQueryModelSql::where();
          QVar11 = QSqlQueryModelSql::sp();
          uStack_48 = QVar11.m_size;
          _q = (undefined1  [16])QVar10;
          QStringBuilder<const_QLatin1String,_const_QLatin1String>::convertTo<QString>
                    (&selectRow::wh,(QStringBuilder<const_QLatin1String,_const_QLatin1String> *)&q);
          __cxa_atexit(QString::~QString,&selectRow::wh,&__dso_handle);
          __cxa_guard_release(&selectRow(int)::wh);
        }
      }
      cVar4 = QString::startsWith(this_00,0x14ff20);
      if (cVar4 != '\0') {
        QString::remove((longlong)this_00,0);
      }
      local_b8.size = 0;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      if (*(long *)(lVar3 + 0x2c0) == 0) {
        uStack_48 = 0;
      }
      else {
        (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1f8))
                  ((QArrayDataPointer<char16_t> *)&q,this);
        local_b8.d = (Data *)q.d;
        local_b8.ptr = (char16_t *)uStack_50;
        _q = ZEXT816(0);
        local_b8.size = uStack_48;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&q);
      }
      *(undefined4 *)(lVar3 + 0x230) = uVar1;
      QString::operator=(this_00,(QString *)&local_98);
      if (uStack_48 == 0) {
        bVar5 = false;
      }
      else {
        newValues.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QSqlRecord::QSqlRecord(&newValues);
        q.d = (QSqlQueryPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QSqlQuery::QSqlQuery(&q,(QSqlDatabase *)(lVar3 + 0x228));
        QSqlQuery::setForwardOnly(&q,true);
        bVar5 = QSqlQuery::exec(&q,(QString *)&local_b8);
        if (bVar5) {
          exists = QSqlQuery::next(&q);
          QSqlQuery::record((QSqlQuery *)&local_78.shared);
          QSqlRecord::operator=(&newValues,(QSqlRecord *)&local_78.shared);
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78.shared);
        }
        else {
          exists = false;
        }
        QSqlQuery::~QSqlQuery(&q);
        if (bVar5) {
          if (exists != false) {
            bVar6 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::contains
                              ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar3 + 0x2e0),
                               &row_local);
            if (!bVar6) {
              curValues.d.d.ptr =
                   (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
              record((QSqlTableModel *)&curValues,row_00);
              iVar7 = QSqlRecord::count(&curValues);
              iVar8 = QSqlRecord::count(&newValues);
              if (iVar7 == iVar8) {
                iVar7 = QSqlRecord::count(&curValues);
                do {
                  if (iVar7 < 1) {
                    QSqlRecord::~QSqlRecord(&curValues);
                    goto LAB_001345f7;
                  }
                  iVar7 = iVar7 + -1;
                  QSqlRecord::value((QVariant *)&q,&curValues,iVar7);
                  QSqlRecord::value((QVariant *)&local_78,&newValues,iVar7);
                  bVar6 = operator!=((QVariant *)&q,(QVariant *)&local_78);
                  QVariant::~QVariant((QVariant *)&local_78);
                  QVariant::~QVariant((QVariant *)&q);
                } while (!bVar6);
              }
              QSqlRecord::~QSqlRecord(&curValues);
            }
          }
          this_01 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                              ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar3 + 0x2e0),
                               &row_local);
          QSqlTableModelPrivate::ModifiedRow::refresh(this_01,exists,&newValues);
          QAbstractItemModel::headerDataChanged(row_00,2,row_local);
          iVar7 = row_local;
          _q = ZEXT416((uint)row_local);
          curValues.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xffffffffffffffff;
          iVar8 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x80))(this);
          local_78._4_4_ = iVar8 + -1;
          local_78._0_4_ = iVar7;
          local_78._8_8_ = 0;
          local_f8.d = (Data *)0x0;
          local_f8.ptr = (int *)0x0;
          local_f8.size = 0;
          local_78._16_8_ = this;
          QAbstractItemModel::dataChanged
                    ((QModelIndex *)this,(QModelIndex *)&q,(QList *)local_78.data);
          QArrayDataPointer<int>::~QArrayDataPointer(&local_f8);
        }
LAB_001345f7:
        QSqlRecord::~QSqlRecord(&newValues);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      goto LAB_00134618;
    }
  }
  bVar5 = false;
LAB_00134618:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::selectRow(int row)
{
    Q_D(QSqlTableModel);

    if (row < 0 || row >= rowCount())
        return false;

    const int table_sort_col = d->sortColumn;
    d->sortColumn = -1;
    const QString table_filter = d->filter;
    d->filter = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement,
                                              d->tableName,
                                              primaryValues(row),
                                              false);
    static const QString wh = SqlTm::where() + SqlTm::sp();
    if (d->filter.startsWith(wh, Qt::CaseInsensitive))
        d->filter.remove(0, wh.size());

    QString stmt;

    if (!d->filter.isEmpty())
        stmt = selectStatement();

    d->sortColumn = table_sort_col;
    d->filter = table_filter;

    if (stmt.isEmpty())
        return false;

    bool exists;
    QSqlRecord newValues;

    {
        QSqlQuery q(d->db);
        q.setForwardOnly(true);
        if (!q.exec(stmt))
            return false;

        exists = q.next();
        newValues = q.record();
    }

    bool needsAddingToCache = !exists || d->cache.contains(row);

    if (!needsAddingToCache) {
        const QSqlRecord curValues = record(row);
        needsAddingToCache = curValues.count() != newValues.count();
        if (!needsAddingToCache) {
            // Look for changed values. Primary key fields are customarily first
            // and probably change less often than other fields, so start at the end.
            for (int f = curValues.count() - 1; f >= 0; --f) {
                if (curValues.value(f) != newValues.value(f)) {
                    needsAddingToCache = true;
                    break;
                }
            }
        }
    }

    if (needsAddingToCache) {
        d->cache[row].refresh(exists, newValues);
        emit headerDataChanged(Qt::Vertical, row, row);
        emit dataChanged(createIndex(row, 0), createIndex(row, columnCount() - 1));
    }

    return true;
}